

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BayesianProbitRegressor::InternalSwap
          (BayesianProbitRegressor *this,BayesianProbitRegressor *other)

{
  Arena *rhs_arena_00;
  Arena *lhs_arena_00;
  string *psVar1;
  Arena *rhs_arena;
  Arena *lhs_arena;
  BayesianProbitRegressor *other_local;
  BayesianProbitRegressor *this_local;
  
  rhs_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  lhs_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&other->super_MessageLite);
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>::
  InternalSwap(&this->features_,&other->features_);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::InternalSwap
            (psVar1,&this->regressioninputfeaturename_,rhs_arena_00,
             &other->regressioninputfeaturename_,lhs_arena_00);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::InternalSwap
            (psVar1,&this->optimisminputfeaturename_,rhs_arena_00,&other->optimisminputfeaturename_,
             lhs_arena_00);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::InternalSwap
            (psVar1,&this->samplingscaleinputfeaturename_,rhs_arena_00,
             &other->samplingscaleinputfeaturename_,lhs_arena_00);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::InternalSwap
            (psVar1,&this->samplingtruncationinputfeaturename_,rhs_arena_00,
             &other->samplingtruncationinputfeaturename_,lhs_arena_00);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::InternalSwap
            (psVar1,&this->meanoutputfeaturename_,rhs_arena_00,&other->meanoutputfeaturename_,
             lhs_arena_00);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::InternalSwap
            (psVar1,&this->varianceoutputfeaturename_,rhs_arena_00,
             &other->varianceoutputfeaturename_,lhs_arena_00);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::InternalSwap
            (psVar1,&this->pessimisticprobabilityoutputfeaturename_,rhs_arena_00,
             &other->pessimisticprobabilityoutputfeaturename_,lhs_arena_00);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::InternalSwap
            (psVar1,&this->sampledprobabilityoutputfeaturename_,rhs_arena_00,
             &other->sampledprobabilityoutputfeaturename_,lhs_arena_00);
  google::protobuf::internal::memswap<12>((char *)&this->bias_,(char *)&other->bias_);
  return;
}

Assistant:

void BayesianProbitRegressor::InternalSwap(BayesianProbitRegressor* other) {
  using std::swap;
  auto* lhs_arena = GetArenaForAllocation();
  auto* rhs_arena = other->GetArenaForAllocation();
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  features_.InternalSwap(&other->features_);
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &regressioninputfeaturename_, lhs_arena,
      &other->regressioninputfeaturename_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &optimisminputfeaturename_, lhs_arena,
      &other->optimisminputfeaturename_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &samplingscaleinputfeaturename_, lhs_arena,
      &other->samplingscaleinputfeaturename_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &samplingtruncationinputfeaturename_, lhs_arena,
      &other->samplingtruncationinputfeaturename_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &meanoutputfeaturename_, lhs_arena,
      &other->meanoutputfeaturename_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &varianceoutputfeaturename_, lhs_arena,
      &other->varianceoutputfeaturename_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &pessimisticprobabilityoutputfeaturename_, lhs_arena,
      &other->pessimisticprobabilityoutputfeaturename_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &sampledprobabilityoutputfeaturename_, lhs_arena,
      &other->sampledprobabilityoutputfeaturename_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(BayesianProbitRegressor, numberoffeatures_)
      + sizeof(BayesianProbitRegressor::numberoffeatures_)
      - PROTOBUF_FIELD_OFFSET(BayesianProbitRegressor, bias_)>(
          reinterpret_cast<char*>(&bias_),
          reinterpret_cast<char*>(&other->bias_));
}